

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

PackageImportItemSyntax * __thiscall slang::parsing::Parser::parsePackageImportItem(Parser *this)

{
  Token doubleColon_00;
  Token package_00;
  Token item_00;
  bool bVar1;
  PackageImportItemSyntax *pPVar2;
  ParserBase *in_RDI;
  Token TVar3;
  Token TVar4;
  Token item;
  Token doubleColon;
  Token package;
  Token *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  TokenKind in_stack_ffffffffffffff6e;
  ParserBase *in_stack_ffffffffffffff80;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 in_stack_ffffffffffffffe8 [16];
  unkbyte10 Var5;
  
  TVar3 = ParserBase::expect(in_stack_ffffffffffffffe8._8_8_,in_stack_ffffffffffffffe8._6_2_);
  Var5 = TVar3._6_10_;
  TVar3 = ParserBase::expect((ParserBase *)TVar3.info,TVar3.rawLen._2_2_);
  Token::Token(in_stack_ffffffffffffff60);
  bVar1 = ParserBase::peek(in_RDI,in_stack_ffffffffffffff6e);
  if (bVar1) {
    TVar4 = ParserBase::consume(in_stack_ffffffffffffff80);
    local_48 = TVar4._0_8_;
    local_38 = local_48;
    local_40 = TVar4.info;
    local_30 = local_40;
  }
  else {
    TVar4 = ParserBase::expect((ParserBase *)((unkuint10)Var5 >> 0x10),(TokenKind)Var5);
    local_58 = TVar4._0_8_;
    local_38 = local_58;
    local_50 = TVar4.info;
    local_30 = local_50;
  }
  local_28 = TVar3._0_8_;
  package_00.rawLen._2_2_ = in_stack_ffffffffffffff6e;
  package_00._0_6_ = in_stack_ffffffffffffff68;
  package_00.info = (Info *)in_RDI;
  doubleColon_00.info = local_30;
  doubleColon_00.kind = (undefined2)local_38;
  doubleColon_00._2_1_ = local_38._2_1_;
  doubleColon_00.numFlags.raw = local_38._3_1_;
  doubleColon_00.rawLen = local_38._4_4_;
  item_00.info = local_28;
  item_00._0_8_ = local_30;
  pPVar2 = slang::syntax::SyntaxFactory::packageImportItem
                     ((SyntaxFactory *)0x31521d,package_00,doubleColon_00,item_00);
  return pPVar2;
}

Assistant:

PackageImportItemSyntax& Parser::parsePackageImportItem() {
    auto package = expect(TokenKind::Identifier);
    auto doubleColon = expect(TokenKind::DoubleColon);

    Token item;
    if (peek(TokenKind::Star))
        item = consume();
    else
        item = expect(TokenKind::Identifier);

    return factory.packageImportItem(package, doubleColon, item);
}